

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_mct.c
# Opt level: O3

void jpc_rct(jas_matrix_t *c0,jas_matrix_t *c1,jas_matrix_t *c2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  jas_seqent_t **ppjVar4;
  jas_seqent_t **ppjVar5;
  jas_seqent_t **ppjVar6;
  jas_seqent_t *pjVar7;
  jas_seqent_t *pjVar8;
  jas_seqent_t *pjVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  
  uVar10 = (uint)c0->numrows_;
  if (c1->numrows_ == (long)(int)uVar10) {
    iVar11 = (int)c0->numcols_;
    if (((c1->numcols_ == (long)iVar11) && (c2->numrows_ == c1->numrows_)) &&
       (c2->numcols_ == c1->numcols_)) {
      if (0 < (int)uVar10) {
        ppjVar4 = c0->rows_;
        ppjVar5 = c1->rows_;
        ppjVar6 = c2->rows_;
        uVar13 = 0;
        do {
          if (0 < iVar11) {
            pjVar7 = ppjVar6[uVar13];
            pjVar8 = ppjVar5[uVar13];
            pjVar9 = ppjVar4[uVar13];
            lVar14 = 0;
            uVar12 = iVar11 + 1;
            do {
              iVar1 = *(int *)((long)pjVar9 + lVar14);
              iVar2 = *(int *)((long)pjVar8 + lVar14);
              iVar3 = *(int *)((long)pjVar7 + lVar14);
              *(long *)((long)pjVar9 + lVar14) = (long)(iVar1 + iVar2 * 2 + iVar3 >> 2);
              *(long *)((long)pjVar8 + lVar14) = (long)(iVar3 - iVar2);
              *(long *)((long)pjVar7 + lVar14) = (long)(iVar1 - iVar2);
              uVar12 = uVar12 - 1;
              lVar14 = lVar14 + 8;
            } while (1 < uVar12);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != (uVar10 & 0x7fffffff));
      }
      return;
    }
  }
  __assert_fail("jas_matrix_numrows(c1) == numrows && jas_matrix_numcols(c1) == numcols && jas_matrix_numrows(c2) == numrows && jas_matrix_numcols(c2) == numcols"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_mct.c"
                ,0x67,"void jpc_rct(jas_matrix_t *, jas_matrix_t *, jas_matrix_t *)");
}

Assistant:

void jpc_rct(jas_matrix_t *c0, jas_matrix_t *c1, jas_matrix_t *c2)
{
	int numrows;
	int numcols;
	int i;
	int j;
	jpc_fix_t *c0p;
	jpc_fix_t *c1p;
	jpc_fix_t *c2p;

	numrows = jas_matrix_numrows(c0);
	numcols = jas_matrix_numcols(c0);

	/* All three matrices must have the same dimensions. */
	assert(jas_matrix_numrows(c1) == numrows && jas_matrix_numcols(c1) == numcols
	  && jas_matrix_numrows(c2) == numrows && jas_matrix_numcols(c2) == numcols);

	for (i = 0; i < numrows; i++) {
		c0p = jas_matrix_getref(c0, i, 0);
		c1p = jas_matrix_getref(c1, i, 0);
		c2p = jas_matrix_getref(c2, i, 0);
		for (j = numcols; j > 0; --j) {
			int r;
			int g;
			int b;
			int y;
			int u;
			int v;
			r = *c0p;
			g = *c1p;
			b = *c2p;
			//y = (r + (g << 1) + b) >> 2;
			y = jpc_fix_asr(r + jpc_fix_asl(g, 1) + b, 2);
			u = b - g;
			v = r - g;
			*c0p++ = y;
			*c1p++ = u;
			*c2p++ = v;
		}
	}
}